

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort.cpp
# Opt level: O0

void mergesort_4way(uchar **strings,size_t n,uchar **tmp)

{
  ostream *poVar1;
  ulong n_00;
  ulong uVar2;
  long lVar3;
  size_t split2;
  size_t split1;
  size_t split0;
  uchar **tmp_local;
  size_t n_local;
  uchar **strings_local;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"mergesort_4way");
  poVar1 = std::operator<<(poVar1,"(), n=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
  std::operator<<(poVar1,"\n");
  if (n < 0x20) {
    insertion_sort(strings,(int)n,0);
  }
  else {
    n_00 = n >> 2;
    uVar2 = n >> 1;
    lVar3 = n_00 + uVar2;
    mergesort_4way(strings,n_00,tmp);
    mergesort_4way(strings + n_00,uVar2 - n_00,tmp);
    mergesort_4way(strings + uVar2,lVar3 - uVar2,tmp);
    mergesort_4way(strings + lVar3,n - lVar3,tmp);
    merge_4way(strings,n_00,strings + n_00,uVar2 - n_00,strings + uVar2,lVar3 - uVar2,
               strings + lVar3,n - lVar3,tmp);
    memcpy(strings,tmp,n << 3);
  }
  return;
}

Assistant:

void
mergesort_4way(unsigned char** strings, size_t n, unsigned char** tmp)
{
	debug() << __func__ << "(), n="<<n<<"\n";
	if (n < 32) {
		insertion_sort(strings, n, 0);
		return;
	}
	const size_t split0 = n/4,
	             split1 = n/2,
	             split2 = split0+split1;
	mergesort_4way(strings,        split0,        tmp);
	mergesort_4way(strings+split0, split1-split0, tmp);
	mergesort_4way(strings+split1, split2-split1, tmp);
	mergesort_4way(strings+split2, n-split2,      tmp);
	merge_4way(strings,        split0,
	           strings+split0, split1-split0,
	           strings+split1, split2-split1,
	           strings+split2, n-split2,
	           tmp);
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
}